

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h263d_vdpu1.c
# Opt level: O3

MPP_RET hal_vpu1_h263d_init(void *hal,MppHalCfg *cfg)

{
  MppBufSlots pvVar1;
  MPP_RET MVar2;
  undefined8 in_RAX;
  void *ptr;
  MPP_RET MVar3;
  
  if (hal == (void *)0x0) {
    _mpp_log_l(2,"hal_vpu_h263d","Assertion %s failed at %s:%d\n",(char *)0x0,"hal",
               "hal_vpu1_h263d_init",CONCAT44((int)((ulong)in_RAX >> 0x20),0x80));
    if ((mpp_debug._3_1_ & 0x10) != 0) {
      abort();
    }
  }
  ptr = mpp_osal_calloc("hal_vpu1_h263d_init",0x194);
  if (ptr == (void *)0x0) {
    _mpp_log_l(2,"hal_vpu_h263d","failed to malloc register ret\n","hal_vpu1_h263d_init");
    MVar3 = MPP_ERR_MALLOC;
  }
  else {
    MVar3 = MPP_OK;
    MVar2 = mpp_dev_init((MppDev *)((long)hal + 0x70),VPU_CLIENT_VDPU1);
    if (MVar2 == MPP_OK) {
      pvVar1 = cfg->packet_slots;
      *(MppBufSlots *)((long)hal + 0x58) = cfg->frame_slots;
      *(MppBufSlots *)((long)hal + 0x60) = pvVar1;
      *(MppCbCtx **)((long)hal + 0x68) = cfg->dec_cb;
      *(void **)((long)hal + 0x88) = ptr;
    }
    else {
      _mpp_log_l(2,"hal_vpu_h263d","mpp_dev_init failed. ret: %d\n","hal_vpu1_h263d_init",
                 (ulong)(uint)MVar2);
      mpp_osal_free("hal_vpu1_h263d_init",ptr);
      MVar3 = MPP_ERR_UNKNOW;
    }
  }
  return MVar3;
}

Assistant:

MPP_RET hal_vpu1_h263d_init(void *hal, MppHalCfg *cfg)
{
    MPP_RET ret = MPP_OK;
    Vpu1H263dRegSet_t *regs = NULL;
    hal_h263_ctx *ctx = (hal_h263_ctx *)hal;

    mpp_assert(hal);

    regs = mpp_calloc(Vpu1H263dRegSet_t, 1);
    if (NULL == regs) {
        mpp_err_f("failed to malloc register ret\n");
        ret = MPP_ERR_MALLOC;
        goto ERR_RET;
    }

    ret = mpp_dev_init(&ctx->dev, VPU_CLIENT_VDPU1);
    if (ret) {
        mpp_err_f("mpp_dev_init failed. ret: %d\n", ret);
        ret = MPP_ERR_UNKNOW;
        goto ERR_RET;
    }

    ctx->frm_slots  = cfg->frame_slots;
    ctx->pkt_slots  = cfg->packet_slots;
    ctx->dec_cb     = cfg->dec_cb;
    ctx->regs       = (void*)regs;

    return ret;
ERR_RET:
    if (regs) {
        mpp_free(regs);
        regs = NULL;
    }

    return ret;
}